

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O1

_If_sv<soul::Identifier,_basic_string<char>_&> __thiscall
std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
append<soul::Identifier>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this,Identifier *__svt
          )

{
  _If_sv<soul::Identifier,_basic_string<char>_&> pbVar1;
  
  if (__svt->name != (string *)0x0) {
    pbVar1 = (_If_sv<soul::Identifier,_basic_string<char>_&>)
             std::__cxx11::string::append((char *)this,(ulong)(__svt->name->_M_dataplus)._M_p);
    return pbVar1;
  }
  soul::throwInternalCompilerError("isValid()","operator basic_string_view",0x22);
}

Assistant:

bool isValid() const noexcept                                   { return name != nullptr; }